

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O0

int internalSubset(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  ENCODING *enc_local;
  char *end_local;
  char *ptr_local;
  int tok_local;
  PROLOG_STATE *state_local;
  
  switch(tok) {
  case 0xb:
    state_local._4_4_ = 0x37;
    break;
  case 0xd:
    state_local._4_4_ = 0x38;
    break;
  case 0xf:
    state_local._4_4_ = 0;
    break;
  case 0x10:
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (enc->minBytesPerChar << 1),end,"ENTITY");
    if (iVar1 != 0) {
      state->handler = entity0;
      return 0xb;
    }
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (enc->minBytesPerChar << 1),end,"ATTLIST");
    if (iVar1 != 0) {
      state->handler = attlist0;
      return 0x21;
    }
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (enc->minBytesPerChar << 1),end,"ELEMENT");
    if (iVar1 != 0) {
      state->handler = element0;
      return 0x27;
    }
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (enc->minBytesPerChar << 1),end,"NOTATION");
    if (iVar1 != 0) {
      state->handler = notation0;
      return 0x11;
    }
  default:
    state_local._4_4_ = common(state,tok);
    break;
  case 0x1a:
    state->handler = doctype5;
    state_local._4_4_ = 3;
    break;
  case 0x1c:
    state_local._4_4_ = 0x39;
    break;
  case -4:
    state_local._4_4_ = 0;
  }
  return state_local._4_4_;
}

Assistant:

static int PTRCALL
internalSubset(PROLOG_STATE *state,
               int tok,
               const char *ptr,
               const char *end,
               const ENCODING *enc)
{
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_DECL_OPEN:
    if (XmlNameMatchesAscii(enc,
                            ptr + 2 * MIN_BYTES_PER_CHAR(enc),
                            end,
                            KW_ENTITY)) {
      state->handler = entity0;
      return XML_ROLE_ENTITY_NONE;
    }
    if (XmlNameMatchesAscii(enc,
                            ptr + 2 * MIN_BYTES_PER_CHAR(enc),
                            end,
                            KW_ATTLIST)) {
      state->handler = attlist0;
      return XML_ROLE_ATTLIST_NONE;
    }
    if (XmlNameMatchesAscii(enc,
                            ptr + 2 * MIN_BYTES_PER_CHAR(enc),
                            end,
                            KW_ELEMENT)) {
      state->handler = element0;
      return XML_ROLE_ELEMENT_NONE;
    }
    if (XmlNameMatchesAscii(enc,
                            ptr + 2 * MIN_BYTES_PER_CHAR(enc),
                            end,
                            KW_NOTATION)) {
      state->handler = notation0;
      return XML_ROLE_NOTATION_NONE;
    }
    break;
  case XML_TOK_PI:
    return XML_ROLE_PI;
  case XML_TOK_COMMENT:
    return XML_ROLE_COMMENT;
  case XML_TOK_PARAM_ENTITY_REF:
    return XML_ROLE_PARAM_ENTITY_REF;
  case XML_TOK_CLOSE_BRACKET:
    state->handler = doctype5;
    return XML_ROLE_DOCTYPE_NONE;
  case XML_TOK_NONE:
    return XML_ROLE_NONE;
  }
  return common(state, tok);
}